

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O1

void nn_ws_handshake_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int *piVar1;
  void **ppvVar2;
  nn_queue_item *pnVar3;
  char *subj;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  size_t sVar8;
  char *pcVar9;
  size_t hashed_len;
  undefined8 uVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  uint extraout_EDX_07;
  int extraout_EDX_08;
  int unaff_EBP;
  uint uVar11;
  nn_fsm_fn p_Var12;
  nn_usock *self_00;
  nn_fsm *pnVar13;
  nn_fsm *pnVar14;
  nn_fsm_fn p_Var15;
  long lVar16;
  undefined4 uVar17;
  nn_fsm **unaff_R14;
  nn_fsm **ppnVar18;
  ulong uVar19;
  bool bVar20;
  uint8_t rand_key [16];
  nn_iovec open_request;
  nn_fsm **local_c8 [4];
  nn_fsm *local_a8;
  nn_fsm *local_a0;
  nn_fsm *local_98;
  nn_fsm *local_90;
  nn_fsm *local_88;
  nn_fsm *local_80;
  nn_fsm *local_78;
  nn_fsm *local_70;
  nn_fsm *local_68;
  nn_fsm *local_60;
  nn_fsm *local_58 [3];
  nn_iovec local_40;
  
  iVar4 = 0x135ec8;
  iVar5 = 0x135ec8;
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src != -2) goto LAB_001312fc;
    if (type != -2) goto LAB_00131305;
    if (self[0x33].fn != (nn_fsm_fn)0x0) {
      nn_ws_handshake_handler_cold_35();
LAB_0013115e:
      nn_ws_handshake_handler_cold_42();
LAB_00131163:
      iVar4 = unaff_EBP;
      uVar17 = 4;
      goto LAB_001311ef;
    }
    if (self[0x33].shutdown_fn < (nn_fsm_fn)0x4) goto LAB_0013115e;
    src = *(int *)&self[3].stopped.srcptr;
    nn_timer_start((nn_timer *)&self[1].shutdown_fn,src);
    iVar4 = *(int *)((long)&self[1].fn + 4);
    if (iVar4 == 2) {
      p_Var15 = self[0x33].shutdown_fn;
      if (p_Var15 < (nn_fsm_fn)0x1001) {
        *(undefined4 *)&self[1].fn = 2;
        self_00 = *(nn_usock **)&self[3].stopped.type;
        ppnVar18 = &self[4].owner;
        goto LAB_00130e68;
      }
      nn_ws_handshake_handler_cold_36();
LAB_00131173:
      nn_ws_handshake_handler_cold_40();
LAB_00131178:
      nn_ws_handshake_handler_cold_37();
LAB_0013117d:
      nn_ws_handshake_handler_cold_38();
      goto LAB_00131182;
    }
    if (iVar4 == 1) {
      if ((nn_fsm_fn)0x200 < self[0x33].shutdown_fn) goto LAB_00131173;
      *(undefined4 *)&self[1].fn = 4;
      unaff_R14 = local_58;
      nn_random_generate(unaff_R14,0x10);
      hashed_len = 0x19;
      nn_base64_encode((uint8_t *)unaff_R14,0x10,(char *)local_c8,0x19);
      sVar8 = strlen((char *)local_c8);
      if (sVar8 != 0x18) goto LAB_00131178;
      iVar4 = nn_ws_handshake_hash_key
                        ((char *)local_c8,0x18,(char *)&self[0x34].stopped.type,hashed_len);
      if (iVar4 == 0x1c) {
        iVar4 = *(int *)(*(long *)(*(long *)(self[4].shutdown_fn + 0x68) + 0x68) + 4);
        lVar16 = 8;
        src = 0x14ac20;
        do {
          if (*(int *)((long)&nn_ws_optset_vfptr.getopt + lVar16 + 4) == iVar4) {
            ppnVar18 = &self[4].owner;
            uVar10._0_4_ = self[4].state;
            uVar10._4_4_ = self[4].src;
            sprintf((char *)ppnVar18,
                    "GET %s HTTP/1.1\r\nHost: %s\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Key: %s\r\nSec-WebSocket-Version: 13\r\nSec-WebSocket-Protocol: %s\r\n\r\n"
                    ,uVar10,self[4].srcptr,local_c8,
                    *(undefined8 *)((long)&NN_WS_HANDSHAKE_SP_MAP[0].server + lVar16));
            local_40.iov_len = strlen((char *)ppnVar18);
            local_40.iov_base = ppnVar18;
            nn_usock_send(*(nn_usock **)&self[3].stopped.type,&local_40,1);
            return;
          }
          lVar16 = lVar16 + 0x10;
        } while (lVar16 != 0xa8);
        nn_ws_handshake_handler_cold_39();
        type = extraout_EDX;
        goto switchD_0013039b_caseD_5;
      }
      goto LAB_0013117d;
    }
    goto LAB_00131360;
  case 2:
    if (src == 2) goto LAB_00130e05;
    if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_00130e1a;
      if (type != 4) goto LAB_00131373;
      unaff_R14 = &self[4].owner;
      pvVar7 = memchr(unaff_R14,0,0x1000);
      if (pvVar7 == (void *)0x0) goto LAB_00131187;
      sVar8 = strlen((char *)unaff_R14);
      if (0xfff < sVar8) goto LAB_00131191;
      local_c8[0] = unaff_R14;
      pcVar9 = strstr((char *)unaff_R14,"\r\n\r\n");
      iVar4 = 1;
      if (pcVar9 != (char *)0x0) {
        self[0x34].srcptr = (void *)0x0;
        self[0x34].owner = (nn_fsm *)0x0;
        self[0x34].shutdown_fn = (nn_fsm_fn)0x0;
        self[0x34].state = 0;
        self[0x34].src = 0;
        self[0x33].stopped.item.next = (nn_queue_item *)0x0;
        self[0x34].fn = (nn_fsm_fn)0x0;
        self[0x33].stopped.srcptr = (void *)0x0;
        *(undefined8 *)&self[0x33].stopped.type = 0;
        self[0x33].stopped.fsm = (nn_fsm *)0x0;
        *(undefined8 *)&self[0x33].stopped.src = 0;
        self[0x33].owner = (nn_fsm *)0x0;
        self[0x33].ctx = (nn_ctx *)0x0;
        self[0x33].state = 0;
        self[0x33].src = 0;
        self[0x33].srcptr = (void *)0x0;
        self[0x35].stopped.fsm = (nn_fsm *)0x0;
        *(undefined8 *)&self[0x35].stopped.src = 0;
        *(undefined4 *)&self[0x35].stopped.item.next = 0xffffffff;
        iVar5 = nn_ws_match_token("GET ",(char **)local_c8,0,iVar5);
        if (iVar5 != 0) {
          uVar10 = 0;
          iVar5 = nn_ws_match_value(" ",(char **)local_c8,0,0,(char **)&self[0x35].stopped,
                                    (size_t *)&self[0x35].stopped.src);
          if (((iVar5 != 0) &&
              (iVar5 = nn_ws_match_token("HTTP/1.1",(char **)local_c8,0,(int)uVar10), iVar5 != 0))
             && (iVar5 = nn_ws_match_token("\r\n",(char **)local_c8,0,(int)uVar10), iVar5 != 0)) {
            ppvVar2 = &self[0x33].stopped.srcptr;
            local_80 = (nn_fsm *)&self[0x33].stopped.item;
            local_90 = (nn_fsm *)&self[0x34].shutdown_fn;
            local_a0 = (nn_fsm *)&self[0x34].srcptr;
            local_60 = (nn_fsm *)&self[0x33].ctx;
            local_78 = (nn_fsm *)&self[0x33].stopped.src;
            piVar1 = &self[0x33].stopped.type;
            local_88 = self + 0x34;
            local_98 = (nn_fsm *)&self[0x34].state;
            local_a8 = (nn_fsm *)&self[0x34].owner;
            local_68 = (nn_fsm *)&self[0x35].stopped.srcptr;
            local_70 = (nn_fsm *)&self[0x35].stopped.type;
            do {
              if (*(uint8_t *)local_c8[0] == '\0') {
LAB_00131043:
                if (*(uint8_t *)local_c8[0] != '\0') goto LAB_001312e9;
                iVar4 = -1;
                uVar17 = 3;
                lVar16._0_4_ = self[0x33].state;
                lVar16._4_4_ = self[0x33].src;
                if ((((lVar16 == 0) || (pcVar9 = (char *)*ppvVar2, pcVar9 == (char *)0x0)) ||
                    (pnVar13 = (nn_fsm *)local_80->fn, pnVar13 == (nn_fsm *)0x0)) ||
                   ((self[0x33].stopped.fsm == (nn_fsm *)0x0 ||
                    ((nn_fsm *)local_90->fn == (nn_fsm *)0x0)))) goto LAB_001311ef;
                iVar5 = nn_ws_validate_value
                                  ("13",(char *)local_90->fn,(size_t)local_98->fn,(int)uVar10);
                unaff_EBP = -1;
                if (iVar5 == 0) goto LAB_00131163;
                iVar5 = nn_ws_validate_value("websocket",pcVar9,*(size_t *)piVar1,(int)uVar10);
                if ((iVar5 == 0) ||
                   (iVar5 = nn_ws_validate_value
                                      ("Upgrade",(char *)pnVar13,(size_t)local_88->fn,(int)uVar10),
                   iVar5 == 0)) goto LAB_001311ef;
                pnVar13 = (nn_fsm *)local_a0->fn;
                if (pnVar13 == (nn_fsm *)0x0) goto LAB_00131196;
                pnVar14 = (nn_fsm *)local_a8->fn;
                lVar16 = 8;
                uVar17 = 7;
                goto LAB_0013112c;
              }
              iVar4 = nn_ws_match_token("Host:",(char **)local_c8,1,(int)uVar10);
              pnVar13 = (nn_fsm *)&self[0x33].state;
              pnVar14 = (nn_fsm *)&self[0x33].srcptr;
              if (((((iVar4 == 0) &&
                    (iVar4 = nn_ws_match_token("Origin:",(char **)local_c8,1,(int)uVar10),
                    pnVar13 = (nn_fsm *)&self[0x33].owner, pnVar14 = local_60, iVar4 == 0)) &&
                   ((iVar4 = nn_ws_match_token("Sec-WebSocket-Key:",(char **)local_c8,1,(int)uVar10)
                    , pnVar13 = (nn_fsm *)&self[0x33].stopped, pnVar14 = local_78, iVar4 == 0 &&
                    ((iVar4 = nn_ws_match_token("Upgrade:",(char **)local_c8,1,(int)uVar10),
                     pnVar13 = (nn_fsm *)ppvVar2, pnVar14 = (nn_fsm *)piVar1, iVar4 == 0 &&
                     (iVar4 = nn_ws_match_token("Connection:",(char **)local_c8,1,(int)uVar10),
                     pnVar13 = local_80, pnVar14 = local_88, iVar4 == 0)))))) &&
                  (iVar4 = nn_ws_match_token("Sec-WebSocket-Version:",(char **)local_c8,1,
                                             (int)uVar10), pnVar13 = local_90, pnVar14 = local_98,
                  iVar4 == 0)) &&
                 ((iVar4 = nn_ws_match_token("Sec-WebSocket-Protocol:",(char **)local_c8,1,
                                             (int)uVar10), pnVar13 = local_a0, pnVar14 = local_a8,
                  iVar4 == 0 &&
                  (iVar4 = nn_ws_match_token("Sec-WebSocket-Extensions:",(char **)local_c8,1,
                                             (int)uVar10), pnVar13 = local_68, pnVar14 = local_70,
                  iVar4 == 0)))) {
                iVar4 = nn_ws_match_token("\r\n",(char **)local_c8,1,(int)uVar10);
                if (iVar4 != 0) goto LAB_00131043;
                pnVar13 = (nn_fsm *)0x0;
                pnVar14 = (nn_fsm *)0x0;
              }
              uVar10 = 1;
              iVar4 = nn_ws_match_value("\r\n",(char **)local_c8,1,1,(char **)pnVar13,
                                        (size_t *)pnVar14);
            } while (iVar4 != 0);
            iVar4 = 1;
          }
        }
      }
      goto LAB_001311f6;
    }
    goto LAB_00131330;
  case 3:
    if (src == 2) goto LAB_00130ded;
    if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_00130e1a;
      if (type == 3) goto LAB_00130f9f;
      nn_ws_handshake_handler_cold_22();
      type = extraout_EDX_00;
      goto switchD_0013039b_caseD_4;
    }
    goto LAB_00131315;
  case 4:
switchD_0013039b_caseD_4:
    if (src == 2) goto LAB_00130df9;
    if (src != 1) goto LAB_0013131e;
    if (type == 8) {
      return;
    }
    if (type == 5) goto LAB_00130e1a;
    if (type == 3) {
      *(undefined4 *)&self[1].fn = 5;
      self_00 = *(nn_usock **)&self[3].stopped.type;
      p_Var15 = self[0x33].shutdown_fn;
      ppnVar18 = (nn_fsm **)((long)&self[0x35].stopped.item.next + 4);
      goto LAB_00130e68;
    }
    break;
  case 5:
switchD_0013039b_caseD_5:
    if (src == 2) {
      if (type == 1) goto LAB_00130e1a;
      nn_ws_handshake_handler_cold_9();
      type = extraout_EDX_02;
LAB_00130ded:
      if (type == 1) goto LAB_00130e1a;
      nn_ws_handshake_handler_cold_21();
      type = extraout_EDX_03;
LAB_00130df9:
      if (type == 1) goto LAB_00130e1a;
      nn_ws_handshake_handler_cold_18();
      type = extraout_EDX_04;
LAB_00130e05:
      if (type == 1) goto LAB_00130e1a;
      nn_ws_handshake_handler_cold_24();
      type = extraout_EDX_05;
LAB_00130e11:
      if (type == 1) {
LAB_00130e1a:
        nn_timer_stop((nn_timer *)&self[1].shutdown_fn);
        *(undefined4 *)&self[1].fn = 7;
        return;
      }
      goto LAB_00131359;
    }
    if (src != 1) goto LAB_0013130c;
    if (type == 8) {
      return;
    }
    if (type == 5) goto LAB_00130e1a;
    if (type == 4) {
      unaff_R14 = (nn_fsm **)((long)&self[0x35].stopped.item.next + 4);
      pvVar7 = memchr(unaff_R14,0,0x200);
      if (pvVar7 == (void *)0x0) {
LAB_00131182:
        nn_ws_handshake_handler_cold_15();
LAB_00131187:
        nn_ws_handshake_handler_cold_30();
LAB_0013118c:
        nn_ws_handshake_handler_cold_14();
LAB_00131191:
        nn_ws_handshake_handler_cold_29();
LAB_00131196:
        iVar4 = nn_pipebase_ispeer((nn_pipebase *)self[4].shutdown_fn,0x10);
        uVar11 = (uint)(iVar4 == 0);
        uVar17 = 6;
        if (iVar4 != 0) {
          uVar17 = 0;
        }
LAB_001311ed:
        iVar4 = -uVar11;
        goto LAB_001311ef;
      }
      sVar8 = strlen((char *)unaff_R14);
      if (0x1ff < sVar8) goto LAB_0013118c;
      local_c8[0] = unaff_R14;
      pcVar9 = strstr((char *)unaff_R14,"\r\n\r\n");
      iVar5 = 1;
      if (pcVar9 != (char *)0x0) {
        *(undefined8 *)&self[0x34].stopped.src = 0;
        self[0x34].stopped.srcptr = (void *)0x0;
        self[0x34].ctx = (nn_ctx *)0x0;
        self[0x34].stopped.fsm = (nn_fsm *)0x0;
        self[0x34].srcptr = (void *)0x0;
        self[0x34].owner = (nn_fsm *)0x0;
        self[0x34].shutdown_fn = (nn_fsm_fn)0x0;
        self[0x34].state = 0;
        self[0x34].src = 0;
        self[0x33].stopped.item.next = (nn_queue_item *)0x0;
        self[0x34].fn = (nn_fsm_fn)0x0;
        self[0x33].stopped.srcptr = (void *)0x0;
        *(undefined8 *)&self[0x33].stopped.type = 0;
        self[0x35].state = 0;
        self[0x35].src = 0;
        self[0x35].srcptr = (void *)0x0;
        self[0x35].owner = (nn_fsm *)0x0;
        self[0x35].ctx = (nn_ctx *)0x0;
        iVar4 = nn_ws_match_token("HTTP/1.1 ",(char **)local_c8,0,iVar4);
        if (iVar4 != 0) {
          iVar4 = nn_ws_match_value(" ",(char **)local_c8,0,0,(char **)&self[0x35].state,
                                    (size_t *)&self[0x35].srcptr);
          if (iVar4 != 0) {
            uVar10 = 0;
            iVar4 = nn_ws_match_value("\r\n",(char **)local_c8,0,0,(char **)&self[0x35].owner,
                                      (size_t *)&self[0x35].ctx);
            if (iVar4 != 0) {
              piVar1 = &self[0x34].stopped.src;
              ppvVar2 = &self[0x33].stopped.srcptr;
              pnVar3 = &self[0x33].stopped.item;
              local_88 = (nn_fsm *)&self[0x34].shutdown_fn;
              local_a0 = (nn_fsm *)&self[0x34].srcptr;
              local_60 = (nn_fsm *)&self[0x34].stopped.srcptr;
              local_78 = (nn_fsm *)&self[0x33].stopped.type;
              local_90 = (nn_fsm *)&self[0x34].state;
              local_a8 = (nn_fsm *)&self[0x34].owner;
              local_68 = (nn_fsm *)&self[0x35].stopped.srcptr;
              local_70 = (nn_fsm *)&self[0x35].stopped.type;
              local_98 = (nn_fsm *)&self[0x35].srcptr;
              local_80 = (nn_fsm *)&self[0x35].state;
              do {
                iVar4 = (int)uVar10;
                if (*(uint8_t *)local_c8[0] == '\0') {
LAB_00130edc:
                  if (*(uint8_t *)local_c8[0] != '\0') goto LAB_001312e4;
                  iVar5 = -1;
                  if (((((nn_fsm *)local_80->fn != (nn_fsm *)0x0) &&
                       (pcVar9 = (char *)*ppvVar2, pcVar9 != (char *)0x0)) &&
                      ((pnVar3 = pnVar3->next, pnVar3 != (nn_queue_item *)0x0 &&
                       (((subj = *(char **)piVar1, subj != (char *)0x0 &&
                         (iVar6 = nn_ws_validate_value
                                            ("101",(char *)local_80->fn,(size_t)local_98->fn,iVar4),
                         iVar6 != 0)) &&
                        (iVar6 = nn_ws_validate_value("websocket",pcVar9,(size_t)local_78->fn,iVar4)
                        , iVar6 != 0)))))) &&
                     (iVar6 = nn_ws_validate_value
                                        ("Upgrade",(char *)pnVar3,(size_t)self[0x34].fn,iVar4),
                     iVar6 != 0)) {
                    iVar5 = nn_ws_validate_value
                                      ((char *)&self[0x34].stopped.type,subj,
                                       (size_t)self[0x34].stopped.srcptr,iVar4);
                    iVar5 = iVar5 + -1;
                  }
                  goto LAB_00130f92;
                }
                iVar5 = nn_ws_match_token("Server:",(char **)local_c8,1,iVar4);
                pnVar13 = (nn_fsm *)&self[0x34].ctx;
                pnVar14 = (nn_fsm *)&self[0x34].stopped;
                if (((((iVar5 == 0) &&
                      (iVar5 = nn_ws_match_token("Sec-WebSocket-Accept:",(char **)local_c8,1,iVar4),
                      pnVar13 = (nn_fsm *)piVar1, pnVar14 = local_60, iVar5 == 0)) &&
                     (iVar5 = nn_ws_match_token("Upgrade:",(char **)local_c8,1,iVar4),
                     pnVar13 = (nn_fsm *)ppvVar2, pnVar14 = local_78, iVar5 == 0)) &&
                    ((iVar5 = nn_ws_match_token("Connection:",(char **)local_c8,1,iVar4),
                     pnVar13 = (nn_fsm *)pnVar3, pnVar14 = self + 0x34, iVar5 == 0 &&
                     (iVar5 = nn_ws_match_token("Sec-WebSocket-Version-Server:",(char **)local_c8,1,
                                                iVar4), pnVar13 = local_88, pnVar14 = local_90,
                     iVar5 == 0)))) &&
                   ((iVar5 = nn_ws_match_token("Sec-WebSocket-Protocol-Server:",(char **)local_c8,1,
                                               iVar4), pnVar13 = local_a0, pnVar14 = local_a8,
                    iVar5 == 0 &&
                    (iVar5 = nn_ws_match_token("Sec-WebSocket-Extensions:",(char **)local_c8,1,iVar4
                                              ), pnVar13 = local_68, pnVar14 = local_70, iVar5 == 0)
                    ))) {
                  iVar5 = nn_ws_match_token("\r\n",(char **)local_c8,1,iVar4);
                  if (iVar5 != 0) goto LAB_00130edc;
                  pnVar13 = (nn_fsm *)0x0;
                  pnVar14 = (nn_fsm *)0x0;
                }
                uVar10 = 1;
                iVar4 = nn_ws_match_value("\r\n",(char **)local_c8,1,1,(char **)pnVar13,
                                          (size_t *)pnVar14);
              } while (iVar4 != 0);
              iVar5 = 1;
            }
          }
        }
      }
LAB_00130f92:
      if (iVar5 != 1) {
        if (iVar5 == 0) {
LAB_00130f9f:
          nn_timer_stop((nn_timer *)&self[1].shutdown_fn);
          *(undefined4 *)&self[1].fn = 8;
          return;
        }
        goto LAB_00130e1a;
      }
      p_Var12 = self[0x33].shutdown_fn + (long)self[0x33].fn;
      self[0x33].fn = p_Var12;
      if ((nn_fsm_fn)0x1ff < p_Var12) goto LAB_001312cb;
      if (p_Var12 < (nn_fsm_fn)0x4) goto LAB_001312d5;
      p_Var15 = p_Var12 + (long)&self[0x35].stopped.item;
      uVar19 = 4;
      do {
        iVar4 = bcmp("\r\n\r\n",p_Var15,uVar19);
        if (iVar4 == 0) goto LAB_00131015;
        p_Var15 = p_Var15 + 1;
        uVar19 = uVar19 - 1;
      } while (uVar19 != 0);
      uVar19 = 0;
LAB_00131015:
      if (uVar19 < 4) {
        p_Var15 = (nn_fsm_fn)(4 - uVar19);
        self[0x33].shutdown_fn = p_Var15;
        if ((nn_fsm_fn)0x200 < p_Var15 + (long)p_Var12) goto LAB_00130e1a;
        goto LAB_001312ae;
      }
      goto LAB_001312df;
    }
    goto LAB_00131365;
  case 6:
    if (src == 2) goto LAB_00130e11;
    if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_00130e1a;
      if (type == 3) goto LAB_00130f9f;
      nn_ws_handshake_handler_cold_7();
      type = extraout_EDX_01;
      goto switchD_0013039b_caseD_7;
    }
    goto LAB_00131339;
  case 7:
switchD_0013039b_caseD_7:
    if (src == 1) {
      return;
    }
    if (src != 2) goto LAB_00131342;
    src = 2;
    if (type == 2) {
      nn_usock_swap_owner(*(nn_usock **)&self[3].stopped.type,(nn_fsm_owner *)&self[3].stopped.item)
      ;
      *(undefined8 *)&self[3].stopped.type = 0;
      *(undefined4 *)&self[3].stopped.item.next = 0xffffffff;
      self[4].fn = (nn_fsm_fn)0x0;
      *(undefined4 *)&self[1].fn = 9;
      iVar4 = 2;
LAB_00130dcb:
      nn_fsm_raise(self,(nn_fsm_event *)&self[0x3b].stopped.type,iVar4);
      return;
    }
    goto LAB_00131352;
  case 8:
    if (src == 1) {
      return;
    }
    if (src != 2) goto LAB_00131327;
    if (type == 2) {
      nn_usock_swap_owner(*(nn_usock **)&self[3].stopped.type,(nn_fsm_owner *)&self[3].stopped.item)
      ;
      *(undefined8 *)&self[3].stopped.type = 0;
      *(undefined4 *)&self[3].stopped.item.next = 0xffffffff;
      self[4].fn = (nn_fsm_fn)0x0;
      *(undefined4 *)&self[1].fn = 9;
      iVar4 = 1;
      goto LAB_00130dcb;
    }
    goto LAB_0013134b;
  case 9:
    goto switchD_0013039b_caseD_9;
  default:
    goto switchD_0013039b_default;
  }
  goto LAB_0013136c;
  while (lVar16 = lVar16 + 0x10, lVar16 != 0xa8) {
LAB_0013112c:
    iVar5 = nn_ws_validate_value
                      (*(char **)((long)&NN_WS_HANDSHAKE_SP_MAP[0].server + lVar16),(char *)pnVar13,
                       (size_t)pnVar14,(int)uVar10);
    if (iVar5 != 0) {
      bVar20 = *(int *)(*(long *)(*(long *)(self[4].shutdown_fn + 0x68) + 0x68) + 4) !=
               *(int *)((long)&nn_ws_optset_vfptr.getopt + lVar16);
      uVar11 = (uint)bVar20;
      uVar17 = 6;
      if (!bVar20) {
        uVar17 = 0;
      }
      goto LAB_001311ed;
    }
  }
LAB_001311ef:
  *(undefined4 *)&self[0x35].stopped.item.next = uVar17;
LAB_001311f6:
  if (iVar4 != 1) {
LAB_001311fd:
    *(undefined4 *)&self[1].fn = 3;
    nn_ws_handshake_server_reply((nn_ws_handshake *)self);
    return;
  }
  p_Var12 = self[0x33].shutdown_fn + (long)self[0x33].fn;
  self[0x33].fn = p_Var12;
  if (p_Var12 < (nn_fsm_fn)0x1000) {
    if (p_Var12 < (nn_fsm_fn)0x4) goto LAB_001312d0;
    p_Var15 = p_Var12 + (long)((long)&self[4].srcptr + 4);
    uVar19 = 4;
    do {
      iVar4 = bcmp("\r\n\r\n",p_Var15,uVar19);
      if (iVar4 == 0) goto LAB_0013127e;
      p_Var15 = p_Var15 + 1;
      uVar19 = uVar19 - 1;
    } while (uVar19 != 0);
    uVar19 = 0;
LAB_0013127e:
    if (uVar19 < 4) {
      p_Var15 = (nn_fsm_fn)(4 - uVar19);
      self[0x33].shutdown_fn = p_Var15;
      if ((nn_fsm_fn)0x1000 < p_Var15 + (long)p_Var12) {
        *(undefined4 *)&self[0x35].stopped.item.next = 1;
        goto LAB_001311fd;
      }
LAB_001312ae:
      pnVar3 = &self[0x32].stopped.item;
      *(int *)&pnVar3->next = *(int *)&pnVar3->next + 1;
      self_00 = *(nn_usock **)&self[3].stopped.type;
      ppnVar18 = (nn_fsm **)((long)unaff_R14 + (long)p_Var12);
LAB_00130e68:
      nn_usock_recv(self_00,ppnVar18,(size_t)p_Var15,(int *)0x0);
      return;
    }
  }
  else {
    nn_ws_handshake_handler_cold_28();
LAB_001312cb:
    nn_ws_handshake_handler_cold_13();
LAB_001312d0:
    nn_ws_handshake_handler_cold_27();
LAB_001312d5:
    nn_ws_handshake_handler_cold_12();
  }
  nn_ws_handshake_handler_cold_26();
LAB_001312df:
  nn_ws_handshake_handler_cold_11();
LAB_001312e4:
  nn_ws_handshake_handler_cold_10();
LAB_001312e9:
  nn_ws_handshake_handler_cold_25();
switchD_0013039b_default:
  nn_ws_handshake_handler_cold_43();
switchD_0013039b_caseD_9:
  nn_ws_handshake_handler_cold_1();
LAB_001312fc:
  nn_ws_handshake_handler_cold_33();
LAB_00131305:
  nn_ws_handshake_handler_cold_34();
LAB_0013130c:
  nn_ws_handshake_handler_cold_17();
LAB_00131315:
  nn_ws_handshake_handler_cold_23();
LAB_0013131e:
  nn_ws_handshake_handler_cold_20();
LAB_00131327:
  nn_ws_handshake_handler_cold_3();
LAB_00131330:
  nn_ws_handshake_handler_cold_32();
LAB_00131339:
  nn_ws_handshake_handler_cold_8();
  type = extraout_EDX_06;
LAB_00131342:
  src = type;
  nn_ws_handshake_handler_cold_5();
LAB_0013134b:
  nn_ws_handshake_handler_cold_2();
LAB_00131352:
  nn_ws_handshake_handler_cold_4();
LAB_00131359:
  nn_ws_handshake_handler_cold_6();
LAB_00131360:
  nn_ws_handshake_handler_cold_41();
LAB_00131365:
  nn_ws_handshake_handler_cold_16();
LAB_0013136c:
  nn_ws_handshake_handler_cold_19();
  type = extraout_EDX_07;
LAB_00131373:
  uVar19 = (ulong)(uint)type;
  nn_ws_handshake_handler_cold_31();
  if (extraout_EDX_08 == -3 && src == -2) goto LAB_001313a5;
  while (*(int *)(uVar19 + 0x58) != 10) {
    nn_ws_handshake_shutdown_cold_1();
LAB_001313a5:
    nn_timer_stop((nn_timer *)(uVar19 + 0x60));
    *(undefined4 *)(uVar19 + 0x58) = 10;
  }
  nn_ws_handshake_shutdown_cold_2();
  return;
}

Assistant:

static void nn_ws_handshake_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_ws_handshake *handshaker;

    size_t i;

    handshaker = nn_cont (self, struct nn_ws_handshake, fsm);

    switch (handshaker->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_assert (handshaker->recv_pos == 0);
                nn_assert (handshaker->recv_len >= NN_WS_HANDSHAKE_TERMSEQ_LEN);

                nn_timer_start (&handshaker->timer, handshaker->timeout);

                switch (handshaker->mode) {
                case NN_WS_CLIENT:
                    /*  Send opening handshake to server. */
                    nn_assert (handshaker->recv_len <=
                        sizeof (handshaker->response));
                    handshaker->state = NN_WS_HANDSHAKE_STATE_CLIENT_SEND;
                    nn_ws_handshake_client_request (handshaker);
                    return;
                case NN_WS_SERVER:
                    /*  Begin receiving opening handshake from client. */
                    nn_assert (handshaker->recv_len <=
                        sizeof (handshaker->opening_hs));
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_RECV;
                    nn_usock_recv (handshaker->usock, handshaker->opening_hs,
                        handshaker->recv_len, NULL);
                    return;
                default:
                    /*  Unexpected mode. */
                    nn_assert (0);
                    return;
                }

            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  SERVER_RECV state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_SERVER_RECV:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_RECEIVED:
                /*  Parse bytes received thus far. */
                switch (nn_ws_handshake_parse_client_opening (handshaker)) {
                case NN_WS_HANDSHAKE_INVALID:
                    /*  Opening handshake parsed successfully but does not
                        contain valid values. Respond failure to client. */
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                    nn_ws_handshake_server_reply (handshaker);
                    return;
                case NN_WS_HANDSHAKE_VALID:
                    /*  Opening handshake parsed successfully, and is valid.
                        Respond success to client. */
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                    nn_ws_handshake_server_reply (handshaker);
                    return;
                case NN_WS_HANDSHAKE_RECV_MORE:
                    /*  Not enough bytes have been received to determine
                        validity; remain in the receive state, and retrieve
                        more bytes from client. */
                    handshaker->recv_pos += handshaker->recv_len;

                    /*  Validate the previous recv operation. */
                    nn_assert (handshaker->recv_pos <
                        sizeof (handshaker->opening_hs));

                    /*  Ensure we can back-track at least the length of the
                        termination sequence to determine how many bytes to
                        receive on the next retry. This is an assertion, not
                        a conditional, since under no condition is it
                        necessary to initially receive so few bytes. */
                    nn_assert (handshaker->recv_pos >=
                        (int) NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    /*  We only compare if we have at least one byte to
                        compare against.  When i drops to zero, it means
                        we don't have any bytes to match against, and it is
                        automatically true. */
                    for (i = NN_WS_HANDSHAKE_TERMSEQ_LEN; i > 0; i--) {
                        if (memcmp (NN_WS_HANDSHAKE_TERMSEQ,
                            handshaker->opening_hs + handshaker->recv_pos - i,
                            i) == 0) {
                            break;
                        }
                    }

                    nn_assert (i < NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    handshaker->recv_len = NN_WS_HANDSHAKE_TERMSEQ_LEN - i;

                    /*  In the unlikely case the client would overflow what we
                        assumed was a sufficiently-large buffer to receive the
                        handshake, we fail the client. */
                    if (handshaker->recv_len + handshaker->recv_pos >
                        sizeof (handshaker->opening_hs)) {
                        handshaker->response_code =
                            NN_WS_HANDSHAKE_RESPONSE_TOO_BIG;
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                        nn_ws_handshake_server_reply (handshaker);
                    }
                    else {
                        handshaker->retries++;
                        nn_usock_recv (handshaker->usock,
                            handshaker->opening_hs + handshaker->recv_pos,
                            handshaker->recv_len, NULL);
                    }
                    return;
                default:
                    nn_fsm_error ("Unexpected handshake result",
                        handshaker->state, src, type);
                }
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  SERVER_REPLY state.                                                       */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_SERVER_REPLY:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                /*  As per RFC 6455 4.2.2, the handshake is now complete
                    and the connection is immediately ready for send/recv. */
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  CLIENT_SEND state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_CLIENT_SEND:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                handshaker->state = NN_WS_HANDSHAKE_STATE_CLIENT_RECV;
                nn_usock_recv (handshaker->usock, handshaker->response,
                    handshaker->recv_len, NULL);
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  CLIENT_RECV state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_CLIENT_RECV:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_RECEIVED:
                /*  Parse bytes received thus far. */
                switch (nn_ws_handshake_parse_server_response (handshaker)) {
                case NN_WS_HANDSHAKE_INVALID:
                    /*  Opening handshake parsed successfully but does not
                        contain valid values. Fail connection. */
                        nn_timer_stop (&handshaker->timer);
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                    return;
                case NN_WS_HANDSHAKE_VALID:
                    /*  As per RFC 6455 4.2.2, the handshake is now complete
                        and the connection is immediately ready for send/recv. */
                    nn_timer_stop (&handshaker->timer);
                    handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
                    return;
                case NN_WS_HANDSHAKE_RECV_MORE:
                    /*  Not enough bytes have been received to determine
                        validity; remain in the receive state, and retrieve
                        more bytes from client. */
                    handshaker->recv_pos += handshaker->recv_len;

                    /*  Validate the previous recv operation. */
                    nn_assert (handshaker->recv_pos <
                        sizeof (handshaker->response));

                    /*  Ensure we can back-track at least the length of the
                        termination sequence to determine how many bytes to
                        receive on the next retry. This is an assertion, not
                        a conditional, since under no condition is it
                        necessary to initially receive so few bytes. */
                    nn_assert (handshaker->recv_pos >=
                        (int) NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    /*  If i goes to 0, it no need to compare. */
                    for (i = NN_WS_HANDSHAKE_TERMSEQ_LEN; i > 0; i--) {
                        if (memcmp (NN_WS_HANDSHAKE_TERMSEQ,
                            handshaker->response + handshaker->recv_pos - i,
                            i) == 0) {
                            break;
                        }
                    }

                    nn_assert (i < NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    handshaker->recv_len = NN_WS_HANDSHAKE_TERMSEQ_LEN - i;

                    /*  In the unlikely case the client would overflow what we
                        assumed was a sufficiently-large buffer to receive the
                        handshake, we fail the connection. */
                    if (handshaker->recv_len + handshaker->recv_pos >
                        sizeof (handshaker->response)) {
                        nn_timer_stop (&handshaker->timer);
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                    }
                    else {
                        handshaker->retries++;
                        nn_usock_recv (handshaker->usock,
                            handshaker->response + handshaker->recv_pos,
                            handshaker->recv_len, NULL);
                    }
                    return;
                default:
                    nn_fsm_error ("Unexpected handshake result",
                        handshaker->state, src, type);
                }
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  HANDSHAKE_SENT state.                                                     */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_HANDSHAKE_SENT:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                /*  As per RFC 6455 4.2.2, the handshake is now complete
                    and the connection is immediately ready for send/recv. */
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_ERROR state.                                               */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            /*  Ignore. The only circumstance the client would send bytes is
                to notify the server it is closing the connection. Wait for the
                socket to eventually error. */
            return;

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_ws_handshake_leave (handshaker, NN_WS_HANDSHAKE_ERROR);
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_DONE state.                                                */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            /*  Ignore. The only circumstance the client would send bytes is
                to notify the server it is closing the connection. Wait for the
                socket to eventually error. */
            return;

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_ws_handshake_leave (handshaker, NN_WS_HANDSHAKE_OK);
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  The header exchange was either done successfully of failed. There's       */
/*  nothing that can be done in this state except stopping the object.        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_DONE:
        nn_fsm_bad_source (handshaker->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (handshaker->state, src, type);
    }
}